

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O2

bool __thiscall CInput::KeyIsPressed(CInput *this,int Key)

{
  bool bVar1;
  
  bVar1 = KeyState(this,Key);
  return bVar1;
}

Assistant:

bool KeyIsPressed(int Key) const { return KeyState(Key); }